

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::CopyPublicDependenciesAliases
          (Generator *this,string_view copy_from,FileDescriptor *file)

{
  Printer *this_00;
  undefined4 uVar1;
  Generator *pGVar2;
  size_t sVar3;
  uint uVar4;
  FileDescriptor *pFVar5;
  char *pcVar6;
  string_view sVar7;
  string_view filename;
  string_view filename_00;
  string_view local_b0 [2];
  string_view local_90;
  undefined1 local_80 [8];
  string module_alias;
  char *local_58;
  undefined1 local_50 [8];
  string module_name;
  int i;
  FileDescriptor *file_local;
  Generator *this_local;
  string_view copy_from_local;
  
  copy_from_local._M_len = (size_t)copy_from._M_str;
  this_local = (Generator *)copy_from._M_len;
  module_name.field_2._12_4_ = 0;
  while( true ) {
    uVar1 = module_name.field_2._12_4_;
    uVar4 = FileDescriptor::public_dependency_count(file);
    pcVar6 = (char *)(ulong)uVar4;
    if ((int)uVar4 <= (int)uVar1) break;
    pFVar5 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    join_0x00000010_0x00000000_ = FileDescriptor::name(pFVar5);
    filename._M_str = pcVar6;
    filename._M_len = (size_t)local_58;
    ModuleName_abi_cxx11_((string *)local_50,(python *)module_alias.field_2._8_8_,filename);
    pFVar5 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    sVar7 = FileDescriptor::name(pFVar5);
    filename_00._M_len = sVar7._M_str;
    filename_00._M_str = (char *)sVar7._M_len;
    local_90 = sVar7;
    python::(anonymous_namespace)::ModuleAlias_abi_cxx11_
              ((string *)local_80,(_anonymous_namespace_ *)sVar7._M_len,filename_00);
    this_00 = this->printer_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_b0,
               "try:\n  $alias$ = $copy_from$.$alias$\nexcept AttributeError:\n  $alias$ = $copy_from$.$module$\n"
              );
    io::Printer::
    Print<char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[10],std::basic_string_view<char,std::char_traits<char>>>
              (this_00,local_b0[0],(char (*) [6])0xa1411c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (char (*) [7])0xa29477,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [10])0xaceeeb,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar3 = copy_from_local._M_len;
    pGVar2 = this_local;
    pFVar5 = FileDescriptor::public_dependency(file,module_name.field_2._12_4_);
    sVar7._M_str = (char *)sVar3;
    sVar7._M_len = (size_t)pGVar2;
    CopyPublicDependenciesAliases(this,sVar7,pFVar5);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_50);
    module_name.field_2._12_4_ = module_name.field_2._12_4_ + 1;
  }
  return;
}

Assistant:

void Generator::CopyPublicDependenciesAliases(
    absl::string_view copy_from, const FileDescriptor* file) const {
  for (int i = 0; i < file->public_dependency_count(); ++i) {
    std::string module_name = ModuleName(file->public_dependency(i)->name());
    std::string module_alias = ModuleAlias(file->public_dependency(i)->name());
    // There's no module alias in the dependent file if it was generated by
    // an old protoc (less than 3.0.0-alpha-1). Use module name in this
    // situation.
    printer_->Print(
        "try:\n"
        "  $alias$ = $copy_from$.$alias$\n"
        "except AttributeError:\n"
        "  $alias$ = $copy_from$.$module$\n",
        "alias", module_alias, "module", module_name, "copy_from", copy_from);
    CopyPublicDependenciesAliases(copy_from, file->public_dependency(i));
  }
}